

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::t_swift_generator
          (t_swift_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  _Rb_tree_node_base *__rhs;
  int iVar1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _Rb_tree_header *p_Var3;
  
  t_generator::t_generator((t_generator *)this,program);
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_swift_generator_00411ed8;
  (this->constants_declarations_)._M_dataplus._M_p =
       (pointer)&(this->constants_declarations_).field_2;
  (this->constants_declarations_)._M_string_length = 0;
  (this->constants_declarations_).field_2._M_local_buf[0] = '\0';
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_decl_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&this->f_impl_);
  p_Var3 = &(this->swift_reserved_words_)._M_t._M_impl.super__Rb_tree_header;
  (this->swift_reserved_words_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->swift_reserved_words_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->swift_reserved_words_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->swift_reserved_words_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->swift_reserved_words_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  t_generator::update_keywords((t_generator *)this);
  this->gen_cocoa_ = false;
  this->promise_kit_ = false;
  this->namespaced_ = false;
  this->safe_enums_ = false;
  this->log_unexpected_ = false;
  this->async_clients_ = false;
  this->debug_descriptions_ = false;
  this->no_strict_ = false;
  p_Var2 = (parsed_options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(parsed_options->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      __rhs = p_Var2 + 1;
      iVar1 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar1 == 0) {
        this->log_unexpected_ = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar1 == 0) {
          this->async_clients_ = true;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar1 == 0) {
            this->no_strict_ = true;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar1 == 0) {
              this->debug_descriptions_ = true;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar1 == 0) {
                this->namespaced_ = true;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)__rhs);
                if (iVar1 == 0) {
                  this->gen_cocoa_ = true;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)__rhs);
                  if (iVar1 == 0) {
                    this->safe_enums_ = true;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)__rhs);
                    if (iVar1 != 0) {
                      __return_storage_ptr__ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __cxa_allocate_exception(0x20);
                      std::operator+(__return_storage_ptr__,"unknown option swift:",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs);
LAB_00363cb1:
                      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                                  std::__cxx11::string::~string);
                    }
                    if (this->gen_cocoa_ == false) {
                      __return_storage_ptr__ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __cxa_allocate_exception(0x20);
                      std::operator+(__return_storage_ptr__,
                                     "PromiseKit only available with Swift 2.x, use `cocoa` option",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs);
                      goto LAB_00363cb1;
                    }
                    this->promise_kit_ = true;
                  }
                }
              }
            }
          }
        }
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_t_oop_generator).super_t_generator.out_dir_base_,0,
             (char *)(this->super_t_oop_generator).super_t_generator.out_dir_base_._M_string_length,
             0x3ab2db);
  return;
}

Assistant:

t_swift_generator(t_program* program,
                    const map<string, string>& parsed_options,
                    const string& option_string)
    : t_oop_generator(program) {
    update_keywords();
	
    (void)option_string;
    map<string, string>::const_iterator iter;

    log_unexpected_ = false;
    async_clients_ = false;
    debug_descriptions_ = false;
    no_strict_ = false;
    namespaced_ = false;
    gen_cocoa_ = false;
    promise_kit_ = false;
    safe_enums_ = false;

    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("log_unexpected") == 0) {
        log_unexpected_ = true;
      } else if( iter->first.compare("async_clients") == 0) {
        async_clients_ = true;
      } else if( iter->first.compare("no_strict") == 0) {
        no_strict_ = true;
      } else if( iter->first.compare("debug_descriptions") == 0) {
        debug_descriptions_ = true;
      } else if( iter->first.compare("namespaced") == 0) {
        namespaced_ = true;
      } else if( iter->first.compare("cocoa") == 0) {
        gen_cocoa_ = true;
      } else if( iter->first.compare("safe_enums") == 0) {
        safe_enums_ = true;
      } else if( iter->first.compare("promise_kit") == 0) {
        if (gen_cocoa_ == false) {
          throw "PromiseKit only available with Swift 2.x, use `cocoa` option" + iter->first;
        }
        promise_kit_ = true;
      } else {
        throw "unknown option swift:" + iter->first;
      }
    }

    out_dir_base_ = "gen-swift";
  }